

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

bool Diligent::IsSRGBFormat(TEXTURE_FORMAT Fmt)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = CONCAT22(in_register_0000003a,Fmt) - 0x48;
  if (((0x21 < uVar1) || ((0x2a8280049U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (CONCAT22(in_register_0000003a,Fmt) != 0x1d)) {
    return false;
  }
  return true;
}

Assistant:

bool IsSRGBFormat(TEXTURE_FORMAT Fmt)
{
    return (Fmt == TEX_FORMAT_RGBA8_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BC1_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BC2_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BC3_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BGRA8_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BGRX8_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BC7_UNORM_SRGB ||
            Fmt == TEX_FORMAT_ETC2_RGB8_UNORM_SRGB ||
            Fmt == TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB ||
            Fmt == TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB);
}